

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QWizardField>::moveAppend
          (QGenericArrayOps<QWizardField> *this,QWizardField *b,QWizardField *e)

{
  undefined8 *puVar1;
  QWizardField *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  Data *pDVar6;
  char *pcVar7;
  QObject *pQVar8;
  PrivateShared *pPVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  QWizardField *pQVar12;
  undefined7 uVar13;
  qsizetype qVar14;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QWizardField>).ptr;
    qVar14 = (this->super_QArrayDataPointer<QWizardField>).size;
    do {
      pQVar2[qVar14].page = b->page;
      pDVar3 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pQVar2[qVar14].name.d.d = pDVar3;
      pcVar4 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pQVar2[qVar14].name.d.ptr = pcVar4;
      qVar5 = (b->name).d.size;
      (b->name).d.size = 0;
      pQVar2[qVar14].name.d.size = qVar5;
      uVar13 = *(undefined7 *)&b->field_0x21;
      pQVar8 = b->object;
      pQVar12 = pQVar2 + qVar14;
      pQVar12->mandatory = b->mandatory;
      *(undefined7 *)&pQVar12->field_0x21 = uVar13;
      *(QObject **)(&pQVar12->mandatory + 8) = pQVar8;
      pDVar6 = (b->property).d.d;
      (b->property).d.d = (Data *)0x0;
      pQVar2[qVar14].property.d.d = pDVar6;
      pcVar7 = (b->property).d.ptr;
      (b->property).d.ptr = (char *)0x0;
      pQVar2[qVar14].property.d.ptr = pcVar7;
      qVar5 = (b->property).d.size;
      (b->property).d.size = 0;
      pQVar2[qVar14].property.d.size = qVar5;
      pDVar6 = (b->changedSignal).d.d;
      (b->changedSignal).d.d = (Data *)0x0;
      pQVar2[qVar14].changedSignal.d.d = pDVar6;
      pcVar7 = (b->changedSignal).d.ptr;
      (b->changedSignal).d.ptr = (char *)0x0;
      pQVar2[qVar14].changedSignal.d.ptr = pcVar7;
      qVar5 = (b->changedSignal).d.size;
      (b->changedSignal).d.size = 0;
      pQVar2[qVar14].changedSignal.d.size = qVar5;
      pPVar9 = (b->initialValue).d.data.shared;
      uVar10 = *(undefined8 *)((long)&(b->initialValue).d.data + 8);
      uVar11 = *(undefined8 *)&(b->initialValue).d.field_0x18;
      puVar1 = (undefined8 *)((long)&pQVar2[qVar14].initialValue.d.data + 0x10);
      *puVar1 = *(undefined8 *)((long)&(b->initialValue).d.data + 0x10);
      puVar1[1] = uVar11;
      pQVar2[qVar14].initialValue.d.data.shared = pPVar9;
      *(undefined8 *)((long)&pQVar2[qVar14].initialValue.d.data + 8) = uVar10;
      (b->initialValue).d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(b->initialValue).d.data + 8) = 0;
      *(undefined8 *)((long)&(b->initialValue).d.data + 0x10) = 0;
      *(undefined8 *)&(b->initialValue).d.field_0x18 = 2;
      b = b + 1;
      qVar14 = (this->super_QArrayDataPointer<QWizardField>).size + 1;
      (this->super_QArrayDataPointer<QWizardField>).size = qVar14;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }